

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_empty_zip64.c
# Opt level: O0

void test_write_format_zip_empty_zip64(void)

{
  archive *paVar1;
  size_t used;
  char buff [256];
  archive_entry *ae;
  archive *a;
  void *in_stack_fffffffffffffec8;
  archive *paVar2;
  size_t *in_stack_fffffffffffffed0;
  char *a_00;
  archive *in_stack_fffffffffffffed8;
  void *buff_00;
  undefined4 in_stack_fffffffffffffee0;
  wchar_t in_stack_fffffffffffffee4;
  archive *in_stack_fffffffffffffee8;
  void *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  wchar_t in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  
  paVar1 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8);
  archive_write_set_format_zip(in_stack_fffffffffffffed8);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b13c,in_stack_ffffffffffffff00);
  archive_write_add_filter_none(paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b17b,in_stack_ffffffffffffff00);
  archive_write_set_bytes_per_block
            (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b1bf,in_stack_ffffffffffffff00);
  archive_write_set_bytes_in_last_block
            (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b203,in_stack_ffffffffffffff00);
  archive_write_set_format_option
            ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,(char *)paVar2);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b257,in_stack_ffffffffffffff00);
  archive_write_open_memory
            (in_stack_fffffffffffffee8,
             (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (size_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b2a5,in_stack_ffffffffffffff00);
  archive_write_close((archive *)0x21b2b2);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                      (longlong)paVar1,(char *)0x21b2e4,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21b2f1);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,0,
                      (char *)0x21b31f,in_stack_ffffffffffffff00);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                      (longlong)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,0,
                      (char *)0x21b353,in_stack_ffffffffffffff00);
  paVar2 = (archive *)0x62;
  a_00 = "98";
  buff_00 = (void *)0x0;
  assertion_equal_mem(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60)
  ;
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)buff_00 >> 0x20),(wchar_t)buff_00,a_00,paVar2);
  archive_read_support_format_zip(paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b413,in_stack_ffffffffffffff00);
  archive_read_open_memory((archive *)a_00,paVar2,0x21b42a);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b45c,in_stack_ffffffffffffff00);
  archive_read_next_header((archive *)a_00,(archive_entry **)paVar2);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b4a4,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21b4b1);
  paVar2 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,0,(char *)0x21b4df,in_stack_ffffffffffffff00);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)buff_00 >> 0x20),(wchar_t)buff_00,a_00,paVar2);
  archive_read_support_format_zip(paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b554,in_stack_ffffffffffffff00);
  read_open_memory((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),buff_00,
                   (size_t)a_00,(size_t)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b5a2,in_stack_ffffffffffffff00);
  archive_read_next_header((archive *)a_00,(archive_entry **)paVar2);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b5ea,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21b5f7);
  paVar2 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,0,(char *)0x21b625,in_stack_ffffffffffffff00);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (wchar_t)((ulong)buff_00 >> 0x20),(wchar_t)buff_00,a_00,paVar2);
  archive_read_support_format_zip(paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b69a,in_stack_ffffffffffffff00);
  read_open_memory_seek
            ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),buff_00,
             (size_t)a_00,(size_t)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b6e6,in_stack_ffffffffffffff00);
  archive_read_next_header((archive *)a_00,(archive_entry **)paVar2);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,(longlong)paVar1,(char *)0x21b72e,in_stack_ffffffffffffff00);
  archive_write_free((archive *)0x21b73b);
  assertion_equal_int((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,(longlong)buff_00,
                      a_00,0,(char *)0x21b769,in_stack_ffffffffffffff00);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_empty_zip64)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Zip format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	/* Force zip writer to use Zip64 extensions. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, "zip", "zip64", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the correct format for an empy Zip archive with Zip64 extensions forced. */
	assertEqualInt(used, 98);
	assertEqualMem(buff,
	    "PK\006\006" /* Zip64 end-of-central-directory record */
	    "\x2c\0\0\0\0\0\0\0"  /* 44 bytes long */
	    "\x2d\0" /* Created by Zip 4.5 */
	    "\x2d\0" /* Extract with Zip 4.5 or later */
	    "\0\0\0\0" /* This is disk #0 */
	    "\0\0\0\0" /* Central dir starts on disk #0 */
	    "\0\0\0\0\0\0\0\0" /* There are 0 entries on this disk ... */
	    "\0\0\0\0\0\0\0\0" /* ... out of 0 entries total ... */
	    "\0\0\0\0\0\0\0\0" /* ... requiring a total of 0 bytes. */
	    "\0\0\0\0\0\0\0\0" /* Directory starts at offset 0 */

	    "PK\006\007" /* Zip64 end-of-central-directory locator */
	    "\0\0\0\0" /* Zip64 EOCD record is on disk #0 .. */
	    "\0\0\0\0\0\0\0\0" /* .. at offset 0 .. */
	    "\1\0\0\0"  /* .. of 1 total disks. */

	    "PK\005\006" /* Regular Zip end-of-central-directory record */
	    "\0\0" /* This is disk #0 */
	    "\0\0" /* Central dir is on disk #0 */
	    "\0\0" /* There are 0 entries on this disk ... */
	    "\0\0" /* ... out of 0 total entries ... */
	    "\0\0\0\0" /* ... requiring a total of 0 bytes. */
	    "\0\0\0\0" /* Directory starts at offset 0. */
	    "\0\0" /* File comment is zero bytes long. */,
	    98);

	/* Verify that we read this kind of empty archive correctly. */
	/* Try with the standard memory reader, and with the test
	   memory reader with and without seek support. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, 98));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, 98, 1));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, 98, 98));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}